

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

void __thiscall
flatbuffers::BinaryAnnotator::BuildString
          (BinaryAnnotator *this,uint64_t string_offset,Object *table,Field *field)

{
  bool bVar1;
  Optional<unsigned_int> OVar2;
  String *pSVar3;
  ulong length;
  BinaryRegionComment *this_00;
  uint64_t length_00;
  ulong offset;
  allocator<char> local_529;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegion local_508;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430 [32];
  string local_410 [32];
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  BinaryRegionCommentType local_3c8;
  _Alloc_hider local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  size_t local_380;
  undefined1 local_378 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  BinaryRegionCommentType local_350;
  _Alloc_hider local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_t local_308;
  undefined1 local_300 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  BinaryRegionCommentType local_2d8;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  size_t local_290;
  BinaryRegionComment local_288;
  BinaryRegionComment local_210;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  bVar1 = ContainsSection(this,string_offset);
  if (!bVar1) {
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    OVar2 = ReadScalar<unsigned_int>(this,string_offset);
    local_3f0._0_4_ = OK;
    local_3e8._M_p = (pointer)&local_3d8;
    local_3e0 = 0;
    local_3d8._M_local_buf[0] = '\0';
    local_3c0._M_p = (pointer)&local_3b0;
    local_3b8 = 0;
    local_3b0._M_local_buf[0] = '\0';
    local_3a0._M_p = (pointer)&local_390;
    local_398 = 0;
    local_390._M_local_buf[0] = '\0';
    local_380 = 0;
    local_3c8 = StringLength;
    if (((ulong)OVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      length_00 = 0;
      if (string_offset <= this->binary_length_) {
        length_00 = this->binary_length_ - string_offset;
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_410,"4",(allocator<char> *)&local_508);
      local_3f0._0_4_ = ERROR_INCOMPLETE_BINARY;
      std::__cxx11::string::_M_assign((string *)&local_3e8);
      std::__cxx11::string::~string(local_410);
      BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_3f0);
      anon_unknown_45::MakeBinaryRegion
                (&local_508,string_offset,length_00,Unknown,length_00,0,&local_a8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&regions,&local_508);
      BinaryRegionComment::~BinaryRegionComment(&local_508.comment);
      this_00 = &local_a8;
    }
    else {
      length = (ulong)OVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0xffffffff;
      offset = string_offset + length + 4;
      if (offset < this->binary_length_) {
        BinaryRegionComment::BinaryRegionComment(&local_198,(BinaryRegionComment *)local_3f0);
        anon_unknown_45::MakeBinaryRegion(&local_508,string_offset,4,Uint32,0,0,&local_198);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,&local_508);
        BinaryRegionComment::~BinaryRegionComment(&local_508.comment);
        BinaryRegionComment::~BinaryRegionComment(&local_198);
        local_300._8_8_ = &local_2e8;
        local_300._0_4_ = OK;
        local_300._16_8_ = 0;
        local_2e8._M_local_buf[0] = '\0';
        local_2d0._M_p = (pointer)&local_2c0;
        local_2c8 = 0;
        local_2c0._M_local_buf[0] = '\0';
        local_2b0._M_p = (pointer)&local_2a0;
        local_2a8 = 0;
        local_2a0._M_local_buf[0] = '\0';
        local_290 = 0;
        local_2d8 = StringValue;
        BinaryRegionComment::BinaryRegionComment(&local_210,(BinaryRegionComment *)local_300);
        anon_unknown_45::MakeBinaryRegion
                  (&local_508,string_offset + 4,length,Char,length,0,&local_210);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,&local_508);
        BinaryRegionComment::~BinaryRegionComment(&local_508.comment);
        BinaryRegionComment::~BinaryRegionComment(&local_210);
        local_378._8_8_ = &local_360;
        local_378._0_4_ = OK;
        local_378._16_8_ = 0;
        local_360._M_local_buf[0] = '\0';
        local_348._M_p = (pointer)&local_338;
        local_340 = 0;
        local_338._M_local_buf[0] = '\0';
        local_328._M_p = (pointer)&local_318;
        local_320 = 0;
        local_318._M_local_buf[0] = '\0';
        local_308 = 0;
        local_350 = StringTerminator;
        BinaryRegionComment::BinaryRegionComment(&local_288,(BinaryRegionComment *)local_378);
        anon_unknown_45::MakeBinaryRegion(&local_508,offset,1,Char,0,0,&local_288);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,&local_508);
        BinaryRegionComment::~BinaryRegionComment(&local_508.comment);
        BinaryRegionComment::~BinaryRegionComment(&local_288);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_378);
        this_00 = (BinaryRegionComment *)local_300;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_430,"",(allocator<char> *)&local_508);
        local_3f0._0_4_ = ERROR_LENGTH_TOO_LONG;
        std::__cxx11::string::_M_assign((string *)&local_3e8);
        std::__cxx11::string::~string(local_430);
        BinaryRegionComment::BinaryRegionComment(&local_120,(BinaryRegionComment *)local_3f0);
        anon_unknown_45::MakeBinaryRegion(&local_508,string_offset,4,Uint32,0,0,&local_120);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,&local_508);
        BinaryRegionComment::~BinaryRegionComment(&local_508.comment);
        this_00 = &local_120;
      }
    }
    BinaryRegionComment::~BinaryRegionComment(this_00);
    pSVar3 = reflection::Object::name(table);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,(char *)(pSVar3 + 1),&local_529);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   &local_450,".");
    pSVar3 = reflection::Field::name(field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   (char *)(pSVar3 + 1));
    local_468.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_468.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_468.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         regions.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    regions.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_45::MakeBinarySection
              ((BinarySection *)&local_508,(string *)local_300,String,&local_468);
    AddSection(this,string_offset,(BinarySection *)&local_508);
    BinarySection::~BinarySection((BinarySection *)&local_508);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_468);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::string::~string((string *)&local_450);
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_3f0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&regions);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildString(const uint64_t string_offset,
                                  const reflection::Object *const table,
                                  const reflection::Field *const field) {
  // Check if we have already generated this string section, and this is a
  // shared string instance.
  if (ContainsSection(string_offset)) { return; }

  std::vector<BinaryRegion> regions;
  const auto string_length = ReadScalar<uint32_t>(string_offset);

  BinaryRegionComment string_length_comment;
  string_length_comment.type = BinaryRegionCommentType::StringLength;

  if (!string_length.has_value()) {
    const uint64_t remaining = RemainingBytes(string_offset);

    SetError(string_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    regions.push_back(MakeBinaryRegion(string_offset, remaining,
                                       BinaryRegionType::Unknown, remaining, 0,
                                       string_length_comment));

  } else {
    const uint32_t string_size = string_length.value();
    const uint64_t string_end =
        string_offset + sizeof(uint32_t) + string_size + sizeof(char);

    if (!IsValidOffset(string_end - 1)) {
      SetError(string_length_comment,
               BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);

      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));
    } else {
      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));

      BinaryRegionComment string_comment;
      string_comment.type = BinaryRegionCommentType::StringValue;

      regions.push_back(MakeBinaryRegion(string_offset + sizeof(uint32_t),
                                         string_size, BinaryRegionType::Char,
                                         string_size, 0, string_comment));

      BinaryRegionComment string_terminator_comment;
      string_terminator_comment.type =
          BinaryRegionCommentType::StringTerminator;

      regions.push_back(MakeBinaryRegion(
          string_offset + sizeof(uint32_t) + string_size, sizeof(char),
          BinaryRegionType::Char, 0, 0, string_terminator_comment));
    }
  }

  AddSection(string_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               BinarySectionType::String, std::move(regions)));
}